

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,ExclusivePublication *publication)

{
  int32_t iVar1;
  string *channel;
  string local_40;
  string *local_20;
  string *recordingChannel;
  ExclusivePublication *publication_local;
  AeronArchive *this_local;
  
  recordingChannel = (string *)publication;
  publication_local = (ExclusivePublication *)this;
  channel = ExclusivePublication::channel_abi_cxx11_(publication);
  iVar1 = ExclusivePublication::sessionId((ExclusivePublication *)recordingChannel);
  ChannelUri::addSessionId(&local_40,channel,iVar1);
  local_20 = &local_40;
  iVar1 = ExclusivePublication::streamId((ExclusivePublication *)recordingChannel);
  stopRecording(this,&local_40,iVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void AeronArchive::stopRecording(const aeron::ExclusivePublication& publication) {
    const std::string& recordingChannel = ChannelUri::addSessionId(publication.channel(), publication.sessionId());

    stopRecording(recordingChannel, publication.streamId());
}